

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_FinishOddDivBy2(uint32 value,ScriptContext *scriptContext)

{
  Var pvVar1;
  
  pvVar1 = JavascriptNumber::ToVar((double)value + 0.5);
  return pvVar1;
}

Assistant:

Var JavascriptOperators::OP_FinishOddDivBy2(uint32 value, ScriptContext *scriptContext)
    {
        return JavascriptNumber::New((double)(value + 0.5), scriptContext);
    }